

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cc
# Opt level: O1

Range * re2c::Range::add(Range *r1,Range *r2)

{
  Range *head;
  Range *tail;
  Range *local_30;
  Range *local_28;
  
  local_30 = (Range *)0x0;
  local_28 = (Range *)0x0;
  if (r2 != (Range *)0x0 && r1 != (Range *)0x0) {
    do {
      if (r1->lb < r2->lb) {
        append_overlapping(&local_30,&local_28,r1);
        r1 = r1->nx;
      }
      else {
        append_overlapping(&local_30,&local_28,r2);
        r2 = r2->nx;
      }
    } while ((r1 != (Range *)0x0) && (r2 != (Range *)0x0));
  }
  if (r1 != (Range *)0x0) {
    do {
      append_overlapping(&local_30,&local_28,r1);
      r1 = r1->nx;
    } while (r1 != (Range *)0x0);
  }
  if (r2 != (Range *)0x0) {
    do {
      append_overlapping(&local_30,&local_28,r2);
      r2 = r2->nx;
    } while (r2 != (Range *)0x0);
  }
  return local_30;
}

Assistant:

Range * Range::add (const Range * r1, const Range * r2)
{
	Range * head = NULL;
	Range * tail = NULL;
	for (; r1 && r2;)
	{
		if (r1->lb < r2->lb)
		{
			append_overlapping (head, tail, r1);
			r1 = r1->nx;
		}
		else
		{
			append_overlapping (head, tail, r2);
			r2 = r2->nx;
		}
	}
	for (; r1; r1 = r1->nx)
	{
		append_overlapping (head, tail, r1);
	}
	for (; r2; r2 = r2->nx)
	{
		append_overlapping (head, tail, r2);
	}
	return head;
}